

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaneBasedExecutionQueue.cpp
# Opt level: O0

bool __thiscall QueueJobLess::operator()(QueueJobLess *this,QueueJob *__x,QueueJob *__y)

{
  StringRef RHS;
  StringRef LHS;
  bool bVar1;
  int iVar2;
  JobDescriptor *pJVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  QueueJob *__y_local;
  QueueJob *__x_local;
  QueueJobLess *this_local;
  
  pJVar3 = llbuild::basic::QueueJob::getDescriptor(__x);
  iVar2 = (*pJVar3->_vptr_JobDescriptor[2])();
  LHS.Data._4_4_ = extraout_var;
  LHS.Data._0_4_ = iVar2;
  pJVar3 = llbuild::basic::QueueJob::getDescriptor(__y);
  iVar2 = (*pJVar3->_vptr_JobDescriptor[2])();
  RHS.Data._4_4_ = extraout_var_00;
  RHS.Data._0_4_ = iVar2;
  LHS.Length = extraout_RDX;
  RHS.Length = extraout_RDX_00;
  bVar1 = llvm::operator<(LHS,RHS);
  return bVar1;
}

Assistant:

bool operator()(const llbuild::basic::QueueJob &__x,
                  const llbuild::basic::QueueJob &__y) const {
    return __x.getDescriptor()->getOrdinalName() <
            __y.getDescriptor()->getOrdinalName();
  }